

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O1

int Pdr_NtkFindSatAssign_rec(Aig_Man_t *pAig,Aig_Obj_t *pNode,int Value,Pdr_Set_t *pCube,int Heur)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  uint uVar4;
  Aig_Obj_t *pNode_00;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  char cVar7;
  char cVar8;
  
  while( true ) {
    pAVar3 = pNode;
    if (((ulong)pAVar3 & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    uVar4 = (uint)*(ulong *)&pAVar3->field_0x18;
    if ((uVar4 & 7) == 1) {
      return 1;
    }
    if (pAVar3->TravId == pAig->nTravIds) {
      return (uint)((uVar4 >> 4 & 1) == Value);
    }
    pAVar3->TravId = pAig->nTravIds;
    *(ulong *)&pAVar3->field_0x18 =
         *(ulong *)&pAVar3->field_0x18 & 0xffffffffffffffef | (ulong)((Value & 1U) << 4);
    if ((uVar4 & 7) == 2) break;
    if ((uVar4 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                    ,0x287,
                    "int Pdr_NtkFindSatAssign_rec(Aig_Man_t *, Aig_Obj_t *, int, Pdr_Set_t *, int)")
      ;
    }
    pNode_00 = (Aig_Obj_t *)((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe);
    uVar4 = (uint)pAVar3->pFanin0 & 1;
    if (Value == 0) {
      cVar7 = '\x03';
      if (pNode_00->TravId == pAig->nTravIds) {
        cVar7 = ((*(uint *)&pNode_00->field_0x18 >> 4 & 1) != uVar4) + '\x01';
      }
      if (cVar7 == '\x01') {
        return 1;
      }
      pAVar6 = (Aig_Obj_t *)((ulong)pAVar3->pFanin1 & 0xfffffffffffffffe);
      uVar5 = (uint)pAVar3->pFanin1 & 1;
      cVar8 = '\x03';
      if (pAVar6->TravId == pAig->nTravIds) {
        cVar8 = ((*(uint *)&pAVar6->field_0x18 >> 4 & 1) != uVar5) + '\x01';
      }
      if (cVar8 == '\x01') {
        return 1;
      }
      if ((cVar7 == '\x02') && (cVar8 == '\x02')) {
        return 0;
      }
      pNode = pAVar6;
      Value = uVar5;
      if ((cVar7 != '\x02') && (pNode = pNode_00, Value = uVar4, cVar8 != '\x02')) {
        if (cVar7 != '\x03') {
          __assert_fail("Value0 == PDR_VALX && Value1 == PDR_VALX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                        ,0x29c,
                        "int Pdr_NtkFindSatAssign_rec(Aig_Man_t *, Aig_Obj_t *, int, Pdr_Set_t *, int)"
                       );
        }
        pNode = pAVar6;
        Value = uVar5;
        if (pAVar3->Id % 4 != Heur) {
          pNode = pNode_00;
          Value = uVar4;
        }
      }
    }
    else {
      iVar2 = Pdr_NtkFindSatAssign_rec(pAig,pNode_00,uVar4 ^ 1,pCube,Heur);
      if (iVar2 == 0) {
        return 0;
      }
      pNode = (Aig_Obj_t *)((ulong)pAVar3->pFanin1 & 0xfffffffffffffffe);
      Value = ~(uint)pAVar3->pFanin1 & 1;
    }
  }
  if ((pAVar3->field_0).CioId < pAig->nTruePis) {
    return 1;
  }
  if (((uint)Value < 2) && (iVar2 = (pAVar3->field_0).CioId - pAig->nTruePis, -1 < iVar2)) {
    iVar1 = pCube->nLits;
    pCube->nLits = iVar1 + 1;
    *(int *)(&pCube->field_0x14 + (long)iVar1 * 4) = Value + iVar2 * 2;
    iVar2 = (&pCube->nLits)[pCube->nLits];
    pCube->Sign = pCube->Sign |
                  1L << (((char)(uint)((ulong)((long)iVar2 * 0x82082083) >> 0x25) -
                         (char)(iVar2 >> 0x1f)) * -0x3f + (char)iVar2 & 0x3fU);
    return 1;
  }
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10b,"int Abc_Var2Lit(int, int)");
}

Assistant:

int Pdr_NtkFindSatAssign_rec( Aig_Man_t * pAig, Aig_Obj_t * pNode, int Value, Pdr_Set_t * pCube, int Heur )
{
    int Value0, Value1;
    if ( Aig_ObjIsConst1(pNode) )
        return 1;
    if ( Aig_ObjIsTravIdCurrent(pAig, pNode) )
        return ((int)pNode->fMarkA == Value);
    Aig_ObjSetTravIdCurrent(pAig, pNode);
    pNode->fMarkA = Value;
    if ( Aig_ObjIsCi(pNode) )
    {
//        if ( vSuppLits )
//            Vec_IntPush( vSuppLits, Abc_Var2Lit( Aig_ObjCioId(pNode), !Value ) );
        if ( Saig_ObjIsLo(pAig, pNode) )
        {
//            pCube->Lits[pCube->nLits++] = Abc_Var2Lit( Aig_ObjCioId(pNode) - Saig_ManPiNum(pAig), !Value );
            pCube->Lits[pCube->nLits++] = Abc_Var2Lit( Aig_ObjCioId(pNode) - Saig_ManPiNum(pAig), Value );
            pCube->Sign |= ((word)1 << (pCube->Lits[pCube->nLits-1] % 63));
        }
        return 1;
    }
    assert( Aig_ObjIsNode(pNode) );
    // propagation
    if ( Value ) 
    {
        if ( !Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin0(pNode), !Aig_ObjFaninC0(pNode), pCube, Heur) )
            return 0;
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin1(pNode), !Aig_ObjFaninC1(pNode), pCube, Heur);
    }
    // justification
    Value0 = Pdr_ObjSatValue( pAig, Aig_ObjFanin0(pNode), Aig_ObjFaninC0(pNode) );
    if ( Value0 == PDR_VAL0 )
        return 1;
    Value1 = Pdr_ObjSatValue( pAig, Aig_ObjFanin1(pNode), Aig_ObjFaninC1(pNode) );
    if ( Value1 == PDR_VAL0 )
        return 1;
    if ( Value0 == PDR_VAL1 && Value1 == PDR_VAL1 )
        return 0;
    if ( Value0 == PDR_VAL1 )
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin1(pNode), Aig_ObjFaninC1(pNode), pCube, Heur);
    if ( Value1 == PDR_VAL1 )
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin0(pNode), Aig_ObjFaninC0(pNode), pCube, Heur);
    assert( Value0 == PDR_VALX && Value1 == PDR_VALX );
    // decision making
//    if ( rand() % 10 == Heur )
    if ( Aig_ObjId(pNode) % 4 == Heur )
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin1(pNode), Aig_ObjFaninC1(pNode), pCube, Heur);
    else
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin0(pNode), Aig_ObjFaninC0(pNode), pCube, Heur);
}